

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<int>::SolveSOR
          (TPZMatrix<int> *this,int64_t *numiterations,TPZFMatrix<int> *F,TPZFMatrix<int> *result,
          TPZFMatrix<int> *residual,TPZFMatrix<int> *param_5,REAL overrelax,REAL *tol,
          int FromCurrent,int direction)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  int64_t j;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  long local_98;
  long lVar6;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  if (residual == (TPZFMatrix<int> *)0x0) {
    iVar3 = (int)*tol * 2 + 1;
  }
  else {
    iVar3 = Dot<int>(residual,residual);
    dVar13 = (double)iVar3;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    iVar3 = (int)dVar13;
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  lVar7 = lVar6 + -1;
  bVar12 = direction != -1;
  lVar9 = 0;
  if (bVar12) {
    lVar7 = 0;
  }
  lVar8 = -1;
  if (bVar12) {
    lVar8 = lVar6;
  }
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
    lVar9 = 0;
    do {
      if (ABS((double)iVar3) <= ABS(*tol)) break;
      if (lVar1 < 1) {
        dVar13 = 0.0;
      }
      else {
        local_98 = 0;
        lVar11 = 0;
        iVar3 = 0;
        lVar2 = lVar7;
        do {
          for (; lVar2 != lVar8; lVar2 = lVar2 + (ulong)bVar12 * 2 + -1) {
            iVar4 = (*(F->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x24])(F,lVar2,lVar11);
            if (0 < lVar6) {
              lVar10 = 0;
              do {
                iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar2,lVar10);
                if (((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow <= lVar10) ||
                   ((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar11)) {
                  TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                iVar4 = iVar4 - iVar5 * *(int *)((long)result->fElem +
                                                lVar10 * 4 +
                                                (result->super_TPZMatrix<int>).super_TPZBaseMatrix.
                                                fRow * local_98);
                lVar10 = lVar10 + 1;
              } while (lVar6 != lVar10);
            }
            iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar2,lVar2);
            if (((lVar2 < 0) || ((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow <= lVar2))
               || ((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar11)) {
              TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            result->fElem[(result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow * lVar11 + lVar2]
                 = result->fElem
                   [(result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow * lVar11 + lVar2] +
                   (iVar4 * (int)overrelax) / iVar5;
            iVar3 = iVar3 + iVar4 * iVar4;
          }
          lVar11 = lVar11 + 1;
          local_98 = local_98 + 4;
          lVar2 = lVar7;
        } while (lVar11 != lVar1);
        dVar13 = (double)iVar3;
      }
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      iVar3 = (int)dVar13;
      lVar9 = lVar9 + 1;
    } while (lVar9 < *numiterations);
  }
  if (residual != (TPZFMatrix<int> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar9;
  *tol = ABS((double)iVar3);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}